

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::udf_several_constant_input<int,5>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int *piVar1;
  int *piVar2;
  idx_t iVar3;
  VectorType in_DL;
  DataChunk *in_RDI;
  idx_t i;
  int *ldata;
  int *result_data;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  ulong uVar4;
  ulong uVar5;
  
  duckdb::Vector::SetVectorType(in_DL);
  piVar1 = ConstantVector::GetData<int>((Vector *)0x4ca16c);
  vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  piVar2 = ConstantVector::GetData<int>((Vector *)0x4ca188);
  uVar4 = 0;
  while( true ) {
    uVar5 = uVar4;
    iVar3 = DataChunk::size(in_RDI);
    if (iVar3 <= uVar4) break;
    piVar1[uVar5] = piVar2[uVar5];
    uVar4 = uVar5 + 1;
  }
  return;
}

Assistant:

static void udf_several_constant_input(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<TYPE>(result);
	auto ldata = ConstantVector::GetData<TYPE>(input.data[NUM_INPUT - 1]);

	for (idx_t i = 0; i < input.size(); i++) {
		result_data[i] = ldata[i];
	}
}